

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  StringifySink *this_00;
  allocator<int> *this_01;
  int *piVar1;
  undefined4 uVar2;
  key_arg<int> kVar3;
  bool bVar4;
  Edition EVar5;
  int iVar6;
  int iVar7;
  FileDescriptor *pFVar8;
  FileOptions *from;
  DescriptorPool *pool;
  EnumDescriptor *this_02;
  FieldDescriptor *pFVar9;
  Descriptor *pDVar10;
  ServiceDescriptor *this_03;
  Edition edition;
  string_view sVar11;
  Arg local_690;
  string_view local_660;
  int local_64c;
  Descriptor *pDStack_648;
  int i_5;
  Descriptor *containing_type;
  Descriptor *pDStack_638;
  int i_4;
  int local_62c;
  undefined1 local_628 [4];
  int i_3;
  Descriptor *local_610;
  int local_604;
  undefined1 local_600 [4];
  int i_2;
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  undefined1 local_5d8 [4];
  int i_1;
  FileOptions full_options;
  Arg local_518;
  string_view local_4e8;
  allocator<char> local_4d1;
  string local_4d0;
  undefined1 local_4b0 [8];
  SourceLocationCommentPrinter package_comment;
  undefined1 local_410 [8];
  vector<int,_std::allocator<int>_> path_1;
  Arg local_3d8;
  string_view local_3a8;
  string_view local_398;
  Arg local_388;
  string_view local_358;
  string_view local_348;
  Arg local_338;
  string_view local_308;
  key_arg<int> local_2f8;
  allocator<int> local_2f3;
  key_equal local_2f2;
  hasher local_2f1;
  int i;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  weak_dependencies;
  undefined1 local_2c8 [8];
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  public_dependencies;
  string local_2a0;
  undefined1 local_280 [8];
  SourceLocationCommentPrinter comment_printer;
  Edition local_1bc;
  Arg local_1b8;
  string_view local_188;
  string local_178;
  Arg local_158;
  string_view local_128;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  SourceLocationCommentPrinter syntax_comment;
  value_type_conflict1 local_44;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> path;
  DebugStringOptions *debug_string_options_local;
  FileDescriptor *this_local;
  string *contents;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  local_44 = 0xc;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&local_44);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f0,this,
             (vector<int,_std::allocator<int>_> *)local_40,&local_110,debug_string_options);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f0,__return_storage_ptr__);
  EVar5 = FileDescriptor::edition(this);
  bVar4 = anon_unknown_24::IsLegacyEdition(EVar5);
  if (bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_128,"syntax = \"$0\";\n\n");
    EVar5 = FileDescriptor::edition(this);
    protobuf::(anonymous_namespace)::GetLegacySyntaxName_abi_cxx11_
              (&local_178,(_anonymous_namespace_ *)(ulong)EVar5,edition);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_158,&local_178);
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_128,&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,"edition = \"$0\";\n\n");
    local_1bc = FileDescriptor::edition(this);
    comment_printer.prefix_.field_2._8_8_ = 0;
    this_00 = (StringifySink *)((long)&comment_printer.prefix_.field_2 + 8);
    absl::lts_20250127::strings_internal::StringifySink::StringifySink(this_00);
    absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
              (&local_1b8,&local_1bc,this_00);
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_188,&local_1b8);
    absl::lts_20250127::strings_internal::StringifySink::~StringifySink
              ((StringifySink *)((long)&comment_printer.prefix_.field_2 + 8));
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f0,__return_storage_ptr__);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"",
             (allocator<char> *)
             ((long)&public_dependencies.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_ + 0xf));
  anon_unknown_24::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FileDescriptor>
            ((SourceLocationCommentPrinter *)local_280,this,&local_2a0,debug_string_options);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&public_dependencies.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_ + 0xf));
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_280,__return_storage_ptr__);
  piVar1 = this->public_dependencies_;
  iVar6 = this->public_dependency_count_;
  this_01 = (allocator<int> *)
            ((long)&weak_dependencies.
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_ + 0xd);
  std::allocator<int>::allocator(this_01);
  absl::lts_20250127::
  flat_hash_set<int,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::raw_hash_set<int*>
            ((flat_hash_set<int,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
              *)local_2c8,piVar1,piVar1 + iVar6,0,
             (hasher *)
             ((long)&weak_dependencies.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_ + 0xf),
             (key_equal *)
             ((long)&weak_dependencies.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_ + 0xe),this_01);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&weak_dependencies.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_ + 0xd));
  piVar1 = this->weak_dependencies_;
  iVar6 = this->weak_dependency_count_;
  std::allocator<int>::allocator(&local_2f3);
  absl::lts_20250127::
  flat_hash_set<int,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::raw_hash_set<int*>
            ((flat_hash_set<int,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
              *)&i,piVar1,piVar1 + iVar6,0,&local_2f1,&local_2f2,&local_2f3);
  std::allocator<int>::~allocator(&local_2f3);
  local_2f8 = 0;
  while( true ) {
    kVar3 = local_2f8;
    iVar6 = dependency_count(this);
    if (iVar6 <= kVar3) break;
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::contains<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                             *)local_2c8,&local_2f8);
    if (bVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_308,"import public \"$0\";\n");
      pFVar8 = dependency(this,local_2f8);
      sVar11 = name(pFVar8);
      local_348 = sVar11;
      absl::lts_20250127::substitute_internal::Arg::Arg(&local_338,sVar11);
      absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_308,&local_338);
    }
    else {
      bVar4 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::contains<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                               *)&i,&local_2f8);
      if (bVar4) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_358,"import weak \"$0\";\n");
        pFVar8 = dependency(this,local_2f8);
        sVar11 = name(pFVar8);
        local_398 = sVar11;
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_388,sVar11);
        absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_358,&local_388);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3a8,"import \"$0\";\n");
        pFVar8 = dependency(this,local_2f8);
        sVar11 = name(pFVar8);
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_3d8,sVar11);
        absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_3a8,&local_3d8);
      }
    }
    local_2f8 = local_2f8 + 1;
  }
  sVar11 = package(this);
  path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)sVar11._M_len;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_410);
    package_comment.prefix_.field_2._12_4_ = 2;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_410,
               (value_type_conflict1 *)(package_comment.prefix_.field_2._M_local_buf + 0xc));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"",&local_4d1);
    anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_4b0,this,
               (vector<int,_std::allocator<int>_> *)local_410,&local_4d0,debug_string_options);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_4b0,__return_storage_ptr__);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4e8,"package $0;\n\n");
    sVar11 = package(this);
    full_options.field_0._152_8_ = sVar11._M_len;
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_518,sVar11);
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_4e8,&local_518);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_4b0,__return_storage_ptr__);
    anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_4b0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_410);
  }
  from = options(this);
  FileOptions::FileOptions((FileOptions *)local_5d8,from);
  anon_unknown_24::CopyFeaturesToOptions<google::protobuf::FileOptions>
            (this->proto_features_,(FileOptions *)local_5d8);
  pool = FileDescriptor::pool(this);
  bVar4 = anon_unknown_24::FormatLineOptions(0,(Message *)local_5d8,pool,__return_storage_ptr__);
  if (bVar4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  groups.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_._12_4_ = 0;
  while( true ) {
    uVar2 = groups.
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_._12_4_;
    iVar6 = enum_type_count(this);
    if (iVar6 <= (int)uVar2) break;
    this_02 = enum_type(this,groups.
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_._12_4_);
    EnumDescriptor::DebugString(this_02,0,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    groups.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_._12_4_ =
         groups.
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         heap_or_soo_._12_4_ + 1;
  }
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::flat_hash_set((flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)local_600);
  local_604 = 0;
  while( true ) {
    iVar6 = local_604;
    iVar7 = extension_count(this);
    if (iVar7 <= iVar6) break;
    EVar5 = FileDescriptor::edition(this);
    pFVar9 = extension(this,local_604);
    bVar4 = anon_unknown_24::IsGroupSyntax(EVar5,pFVar9);
    if (bVar4) {
      pFVar9 = extension(this,local_604);
      local_610 = FieldDescriptor::message_type(pFVar9);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                *)local_628,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)local_600,&local_610);
    }
    local_604 = local_604 + 1;
  }
  local_62c = 0;
  while( true ) {
    iVar6 = local_62c;
    iVar7 = message_type_count(this);
    if (iVar7 <= iVar6) break;
    pDStack_638 = message_type(this,local_62c);
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
            ::contains<google::protobuf::Descriptor_const*>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                        *)local_600,&stack0xfffffffffffff9c8);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      pDVar10 = message_type(this,local_62c);
      Descriptor::DebugString(pDVar10,0,__return_storage_ptr__,debug_string_options,true);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    local_62c = local_62c + 1;
  }
  containing_type._4_4_ = 0;
  while( true ) {
    iVar6 = containing_type._4_4_;
    iVar7 = service_count(this);
    if (iVar7 <= iVar6) break;
    this_03 = service(this,containing_type._4_4_);
    ServiceDescriptor::DebugString(this_03,__return_storage_ptr__,debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    containing_type._4_4_ = containing_type._4_4_ + 1;
  }
  pDStack_648 = (Descriptor *)0x0;
  local_64c = 0;
  while( true ) {
    iVar6 = local_64c;
    iVar7 = extension_count(this);
    if (iVar7 <= iVar6) break;
    pFVar9 = extension(this,local_64c);
    pDVar10 = FieldDescriptor::containing_type(pFVar9);
    if (pDVar10 != pDStack_648) {
      if (0 < local_64c) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pFVar9 = extension(this,local_64c);
      pDStack_648 = FieldDescriptor::containing_type(pFVar9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_660,"extend .$0 {\n");
      sVar11 = Descriptor::full_name(pDStack_648);
      absl::lts_20250127::substitute_internal::Arg::Arg(&local_690,sVar11);
      absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_660,&local_690);
    }
    pFVar9 = extension(this,local_64c);
    FieldDescriptor::DebugString(pFVar9,1,__return_storage_ptr__,debug_string_options);
    local_64c = local_64c + 1;
  }
  iVar6 = extension_count(this);
  if (0 < iVar6) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_280,__return_storage_ptr__);
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~flat_hash_set((flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)local_600);
  FileOptions::~FileOptions((FileOptions *)local_5d8);
  absl::lts_20250127::
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::~flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)&i);
  absl::lts_20250127::
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::~flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)local_2c8);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_280);
  if ((path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    if (IsLegacyEdition(edition())) {
      absl::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                GetLegacySyntaxName(edition()));
    } else {
      absl::SubstituteAndAppend(&contents, "edition = \"$0\";\n\n", edition());
    }
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  absl::flat_hash_set<int> public_dependencies(
      public_dependencies_, public_dependencies_ + public_dependency_count_);
  absl::flat_hash_set<int> weak_dependencies(
      weak_dependencies_, weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.contains(i)) {
      absl::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                dependency(i)->name());
    } else if (weak_dependencies.contains(i)) {
      absl::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                dependency(i)->name());
    } else {
      absl::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    absl::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  FileOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (FormatLineOptions(0, full_options, pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (!groups.contains(message_type(i))) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents, debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}